

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O2

void __thiscall
xray_re::se_smart_cover::state_read(se_smart_cover *this,xr_packet *packet,uint16_t size)

{
  byte bVar1;
  pointer pcVar2;
  vector<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
  *pvVar3;
  string *value;
  int i;
  uint uVar4;
  loophole local_40;
  
  cse_smart_cover::state_read(&this->super_cse_smart_cover,packet,size);
  if (0x7f < (this->super_cse_smart_cover).super_cse_alife_dynamic_object.super_cse_alife_object.
             super_cse_abstract.m_version) {
    xr_packet::r_sz(packet,&this->m_last_description);
    xr_packet::r<unsigned_char>(packet,&this->m_loopholes_count);
    bVar1 = this->m_loopholes_count;
    if ((ulong)bVar1 != 0) {
      pvVar3 = (vector<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
                *)operator_new(0x18);
      (pvVar3->
      super__Vector_base<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar3->
      super__Vector_base<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar3->
      super__Vector_base<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this->m_loopholes = pvVar3;
      std::
      vector<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
      ::reserve(pvVar3,(ulong)bVar1);
      for (uVar4 = 0; uVar4 < this->m_loopholes_count; uVar4 = uVar4 + 1) {
        value = (string *)operator_new(0x20);
        (value->_M_dataplus)._M_p = (pointer)&value->field_2;
        value->_M_string_length = 0;
        (value->field_2)._M_local_buf[0] = '\0';
        xr_packet::r_sz(packet,value);
        pvVar3 = this->m_loopholes;
        pcVar2 = (value->_M_dataplus)._M_p;
        local_40.enabled = xr_packet::r_bool(packet);
        local_40.id = pcVar2;
        std::
        vector<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
        ::emplace_back<xray_re::se_smart_cover::loophole>(pvVar3,&local_40);
      }
    }
  }
  return;
}

Assistant:

void se_smart_cover::state_read(xr_packet& packet, uint16_t size)
{
	cse_smart_cover::state_read(packet, size);
	if (m_version >= CSE_VERSION_0x80) {
		packet.r_sz(m_last_description);
		packet.r_u8(m_loopholes_count);

		if (m_loopholes_count > 0)
		{
			m_loopholes = new std::vector<loophole>();

			m_loopholes->reserve(m_loopholes_count);

			for (int i = 0; i < m_loopholes_count; ++i)
			{
				std::string *id = new std::string;
				packet.r_sz(*id);
				m_loopholes->push_back(loophole(id->c_str(), packet.r_bool()));
			}
		}
	}
}